

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

void __thiscall
minja::SetTemplateNode::do_render
          (SetTemplateNode *this,ostringstream *param_2,shared_ptr<minja::Context> *context)

{
  bool bVar1;
  runtime_error *this_00;
  element_type *peVar2;
  long in_RDI;
  Value value;
  Value *this_01;
  undefined1 local_e8 [16];
  string *in_stack_ffffffffffffff28;
  Value *in_stack_ffffffffffffff30;
  Value local_98;
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x40));
  if (!bVar1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"SetTemplateNode.template_value is null");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__shared_ptr_access<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x329cf5);
  this_01 = &local_98;
  TemplateNode::render_abi_cxx11_
            ((TemplateNode *)
             value.array_.
             super___shared_ptr<std::vector<minja::Value,_std::allocator<minja::Value>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi,
             (shared_ptr<minja::Context> *)
             value.array_.
             super___shared_ptr<std::vector<minja::Value,_std::allocator<minja::Value>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr);
  Value::Value(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  std::__cxx11::string::~string((string *)&local_98);
  peVar2 = std::__shared_ptr_access<minja::Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<minja::Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x329d3a);
  Value::Value(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  (*peVar2->_vptr_Context[5])(peVar2,local_e8,&local_98.object_);
  Value::~Value(this_01);
  Value::~Value(this_01);
  return;
}

Assistant:

void do_render(std::ostringstream &, const std::shared_ptr<Context> & context) const override {
      if (!template_value) throw std::runtime_error("SetTemplateNode.template_value is null");
      Value value { template_value->render(context) };
      context->set(name, value);
    }